

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O0

NeuralNetwork * addSoftmaxLayer(Model *m,char *name,char *input,char *output)

{
  char *pcVar1;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  Arena *pAVar2;
  NeuralNetworkLayer *softmaxLayer;
  NeuralNetwork *neuralNet;
  char *output_local;
  char *input_local;
  char *name_local;
  Model *m_local;
  NeuralNetworkLayer *local_10;
  
  input_local = name;
  name_local = (char *)m;
  this = CoreML::Specification::Model::mutable_neuralnetwork(m);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  pcVar1 = input_local;
  m_local = (Model *)&input_local;
  local_10 = this_00;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this_00->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&this_00->name_,pcVar1,pAVar2);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,input);
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,output);
  CoreML::Specification::NeuralNetworkLayer::mutable_softmax(this_00);
  return this;
}

Assistant:

Specification::NeuralNetwork* addSoftmaxLayer(Specification::Model& m, const char *name,  const char *input, const char *output) {
    
    auto neuralNet = m.mutable_neuralnetwork();
    auto softmaxLayer = neuralNet->add_layers();
    
    softmaxLayer->set_name(name);
    softmaxLayer->add_input(input);
    softmaxLayer->add_output(output);
    softmaxLayer->mutable_softmax();
    
    return neuralNet;
}